

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getCubeLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info,int faceNdx)

{
  byte bVar1;
  int i;
  int iVar2;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *pvVar3;
  long lVar4;
  int iVar5;
  pointer pAVar6;
  long lVar7;
  IVec3 levelPixelSize;
  IVec3 levelTexelBlockSize;
  IVec3 size;
  TextureFormat format;
  IVec3 texelBlockPixelSize;
  int local_b0 [4];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_a0;
  int local_98 [4];
  undefined8 local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  TextureFormat local_70;
  anon_unknown_0 local_64 [12];
  ConstPixelBufferAccess local_58;
  
  local_70 = glu::mapGLInternalFormat(info->m_format);
  local_80 = (info->m_size).m_data[2];
  local_88 = *(undefined8 *)(info->m_size).m_data;
  iVar2 = getTexelBlockSize(info->m_format);
  getTexelBlockPixelSize(local_64,info->m_format);
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar6 = (data->
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
           ((ulong)((long)(data->
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6) >> 4);
  if (0 < (int)pvVar3) {
    local_74 = (int)local_88;
    local_78 = local_88._4_4_;
    local_7c = local_80;
    lVar7 = 0;
    local_a0 = __return_storage_ptr__;
    do {
      local_b0[2] = 0;
      local_b0[0] = 0;
      local_b0[1] = 0;
      bVar1 = (byte)lVar7;
      if (info->m_target == 0x8c1a) {
        local_b0[0] = local_74 >> (bVar1 & 0x1f);
        if (local_b0[0] < 2) {
          local_b0[0] = 1;
        }
        local_b0[1] = local_78 >> (bVar1 & 0x1f);
        if (local_b0[1] < 2) {
          local_b0[1] = 1;
        }
        local_b0[2] = local_7c;
      }
      else {
        lVar4 = 0;
        do {
          iVar5 = *(int *)((long)&local_88 + lVar4 * 4) >> (bVar1 & 0x1f);
          if (iVar5 < 2) {
            iVar5 = 1;
          }
          local_b0[lVar4] = iVar5;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
      }
      local_98[2] = 0;
      local_98[0] = 0;
      local_98[1] = 0;
      lVar4 = 0;
      do {
        local_98[lVar4] =
             (local_b0[lVar4] / *(int *)(local_64 + lVar4 * 4) + 1) -
             (uint)(local_b0[lVar4] % *(int *)(local_64 + lVar4 * 4) == 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_58,&local_70,local_b0[0],local_b0[1],local_b0[2],
                 (void *)((long)(local_98[0] * iVar2 * faceNdx * local_98[1] * local_98[2]) +
                         (long)pAVar6[lVar7].m_ptr));
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      emplace_back<tcu::ConstPixelBufferAccess>(local_a0,&local_58);
      lVar7 = lVar7 + 1;
      pAVar6 = (data->
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               (long)(int)((ulong)((long)(data->
                                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6)
                          >> 4);
    } while (lVar7 < (long)pvVar3);
  }
  return pvVar3;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getCubeLevelAccesses (const vector<ArrayBuffer<deUint8> >&	data,
														  const ImageInfo&						info,
														  int									faceNdx)
{
	const tcu::TextureFormat			format				= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size				= info.getSize();
	const int							texelBlockSize		= getTexelBlockSize(info.getFormat());
	const IVec3							texelBlockPixelSize = getTexelBlockPixelSize(info.getFormat());
	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT(info.getTarget() == GL_TEXTURE_CUBE_MAP);
	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelPixelSize			= getLevelSize(info.getTarget(), size, level);
		const IVec3	levelTexelBlockSize		= divRoundUp(levelPixelSize, texelBlockPixelSize);
		const int	levelTexelBlockCount	= levelTexelBlockSize.x() * levelTexelBlockSize.y() * levelTexelBlockSize.z();
		const int	levelSize				= levelTexelBlockCount * texelBlockSize;

		result.push_back(tcu::ConstPixelBufferAccess(format, levelPixelSize.x(), levelPixelSize.y(), levelPixelSize.z(), data[level].getElementPtr(levelSize * faceNdx)));
	}

	return result;
}